

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<ProString>::growAppend
          (QCommonArrayOps<ProString> *this,ProString *b,ProString *e)

{
  long lVar1;
  bool bVar2;
  ProString *e_00;
  ProString *in_RDX;
  ProString *in_RSI;
  QGenericArrayOps<ProString> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QCommonArrayOps<ProString> *c;
  GrowthPosition where;
  ProString *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    e_00 = (ProString *)(((long)in_RDX - (long)in_RSI) / 0x30);
    c = (QCommonArrayOps<ProString> *)0xaaaaaaaaaaaaaaaa;
    this_00 = (ProString *)0xaaaaaaaaaaaaaaaa;
    QArrayDataPointer<ProString>::QArrayDataPointer
              ((QArrayDataPointer<ProString> *)&stack0xffffffffffffffd8);
    bVar2 = q_points_into_range<QtPrivate::QCommonArrayOps<ProString>,ProString_const*>
                      ((ProString **)this_00,c);
    where = (GrowthPosition)((ulong)c >> 0x20);
    if (bVar2) {
      QArrayDataPointer<ProString>::detachAndGrow
                ((QArrayDataPointer<ProString> *)this_00,where,(qsizetype)in_RDI,
                 (ProString **)in_RDX,(QArrayDataPointer<ProString> *)e_00);
    }
    else {
      QArrayDataPointer<ProString>::detachAndGrow
                ((QArrayDataPointer<ProString> *)this_00,where,(qsizetype)in_RDI,
                 (ProString **)in_RDX,(QArrayDataPointer<ProString> *)e_00);
    }
    QGenericArrayOps<ProString>::copyAppend(in_RDI,in_RDX,e_00);
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)e_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }